

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
::_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  Column_dimension_option CVar6;
  ID_index IVar7;
  bool bVar8;
  ID_index IVar9;
  ID_index IVar10;
  ulong uVar11;
  long lVar12;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
  *pIVar13;
  long lVar14;
  long lVar15;
  anon_class_1_0_00000001 local_43;
  anon_class_1_0_00000001 local_42;
  anon_class_1_0_00000001 local_41;
  uint local_40;
  Index local_3c;
  anon_class_8_1_e4bd5e45 local_38;
  
  lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  lVar14 = (ulong)columnIndex1 * 0x40;
  uVar2 = *(uint *)(lVar5 + 0x18 + lVar14);
  lVar15 = (ulong)columnIndex2 * 0x40;
  local_40 = *(uint *)(lVar5 + 0x18 + lVar15);
  uVar11 = (ulong)local_40;
  local_38.targetColumn._0_4_ = uVar2;
  local_3c = columnIndex1;
  if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar8 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_38,&local_40);
  lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  if (bVar8) {
    lVar12 = uVar11 * 0x40;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar5 + lVar12);
    uVar3 = *(uint *)(lVar5 + 0x14 + lVar12);
    pIVar13 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)((ulong)uVar2 * 0x40 + lVar5);
    local_38.targetColumn = pIVar1;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar13,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar8) {
      CVar6.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar10 = (pIVar1->super_Chain_column_option).pivot_;
      IVar9 = (pIVar13->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar13->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar9;
      pIVar13->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar13->super_Chain_column_option).pivot_ = IVar10;
    }
    uVar2 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar3 != uVar2) {
      lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
      uVar4 = *(undefined4 *)(lVar5 + (ulong)uVar3 * 4);
      *(undefined4 *)(lVar5 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar5 + (ulong)uVar2 * 4);
      *(undefined4 *)(lVar5 + (ulong)uVar2 * 4) = uVar4;
    }
    lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar5 + lVar15);
    IVar9 = *(ID_index *)(lVar5 + 0x14 + lVar15);
    pIVar13 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)(lVar14 + lVar5);
    local_38.targetColumn = pIVar1;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar13,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar8) {
      CVar6.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar7 = (pIVar1->super_Chain_column_option).pivot_;
      IVar10 = (pIVar13->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar13->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar10;
      pIVar13->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar13->super_Chain_column_option).pivot_ = IVar7;
    }
    IVar10 = (pIVar1->super_Chain_column_option).pivot_;
    if (IVar9 == IVar10) {
      return local_3c;
    }
  }
  else {
    lVar12 = (ulong)uVar2 * 0x40;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar5 + lVar12);
    uVar2 = *(uint *)(lVar5 + 0x14 + lVar12);
    pIVar13 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)(uVar11 * 0x40 + lVar5);
    local_3c = columnIndex2;
    local_38.targetColumn = pIVar1;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar13,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar8) {
      CVar6.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar10 = (pIVar1->super_Chain_column_option).pivot_;
      IVar9 = (pIVar13->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar13->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar9;
      pIVar13->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar13->super_Chain_column_option).pivot_ = IVar10;
    }
    uVar3 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar2 != uVar3) {
      lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
      uVar4 = *(undefined4 *)(lVar5 + (ulong)uVar2 * 4);
      *(undefined4 *)(lVar5 + (ulong)uVar2 * 4) = *(undefined4 *)(lVar5 + (ulong)uVar3 * 4);
      *(undefined4 *)(lVar5 + (ulong)uVar3 * 4) = uVar4;
    }
    lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar5 + lVar14);
    IVar9 = *(ID_index *)(lVar5 + 0x14 + lVar14);
    pIVar13 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)(lVar15 + lVar5);
    local_38.targetColumn = pIVar1;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar13,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar8) {
      CVar6.dim_ = (pIVar1->super_Column_dimension_option).dim_;
      IVar7 = (pIVar1->super_Chain_column_option).pivot_;
      IVar10 = (pIVar13->super_Chain_column_option).pivot_;
      pIVar1->super_Column_dimension_option =
           (Column_dimension_option)(pIVar13->super_Column_dimension_option).dim_;
      (pIVar1->super_Chain_column_option).pivot_ = IVar10;
      pIVar13->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar13->super_Chain_column_option).pivot_ = IVar7;
    }
    IVar10 = (pIVar1->super_Chain_column_option).pivot_;
    if (IVar9 == IVar10) {
      return local_3c;
    }
  }
  lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
  uVar4 = *(undefined4 *)(lVar5 + (ulong)IVar9 * 4);
  *(undefined4 *)(lVar5 + (ulong)IVar9 * 4) = *(undefined4 *)(lVar5 + (ulong)IVar10 * 4);
  *(undefined4 *)(lVar5 + (ulong)IVar10 * 4) = uVar4;
  return local_3c;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  Index pairedIndex1 = col1.get_paired_chain_index();
  Index pairedIndex2 = col2.get_paired_chain_index();

  bool hasSmallerBirth;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    hasSmallerBirth = (CP::birth(col1.get_pivot()) < CP::birth(col2.get_pivot()));
  } else {
    hasSmallerBirth = birthComp_(pairedIndex1, pairedIndex2);
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }

  if (hasSmallerBirth)
  {
    _matrix()->add_to(pairedIndex1, pairedIndex2);
    _matrix()->add_to(columnIndex1, columnIndex2);

    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::negative_transpose(col1.get_pivot(), col2.get_pivot());
    }

    return columnIndex1;
  }

  _matrix()->add_to(pairedIndex2, pairedIndex1);
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}